

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

string * __thiscall
Config::GetStr(string *__return_storage_ptr__,Config *this,string *key,string *val)

{
  size_type sVar1;
  mapped_type *pmVar2;
  string *val_local;
  string *key_local;
  Config *this_local;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count(&this->config_,key);
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)val);
  }
  else {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->config_,key);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pmVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string Config::GetStr(string key, string val)
{
    if (config_.count(key) == 0)
        return val;
    return config_[key];
}